

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
GameOverIRCCommand::trigger
          (GameOverIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  longlong lVar6;
  uint uVar7;
  string_view in_string;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  basic_string_view<char,_std::char_traits<char>_> rhs_00;
  basic_string_view<char,_std::char_traits<char>_> rhs_01;
  basic_string_view<char,_std::char_traits<char>_> rhs_02;
  basic_string_view<char,_std::char_traits<char>_> rhs_03;
  string local_50;
  char *extraout_RDX;
  
  lVar3 = Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
  if (lVar3 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    bVar2 = false;
    uVar7 = 0;
    while( true ) {
      RenX::getCore();
      uVar4 = RenX::Core::getServerCount();
      if (uVar4 == uVar7) break;
      uVar4 = RenX::getCore();
      lVar3 = RenX::Core::getServer(uVar4);
      cVar1 = RenX::Server::isLogChanType((int)lVar3);
      if (cVar1 != '\0') {
        rhs._M_str = "empty";
        rhs._M_len = 5;
        bVar2 = jessilib::equalsi<char,char>(parameters,rhs);
        if (bVar2) {
          RenX::Server::gameoverWhenEmpty();
        }
        else {
          rhs_00._M_str = "if empty";
          rhs_00._M_len = 8;
          bVar2 = jessilib::equalsi<char,char>(parameters,rhs_00);
          if (bVar2) {
            lVar3 = *(long *)(lVar3 + 0x20);
            lVar5 = RenX::Server::getBotCount();
            bVar2 = true;
            if (lVar3 == lVar5) {
              RenX::Server::gameover();
            }
            goto LAB_0012c288;
          }
          rhs_01._M_str = "now";
          rhs_01._M_len = 3;
          bVar2 = jessilib::equalsi<char,char>(parameters,rhs_01);
          if (bVar2) {
            RenX::Server::gameover();
          }
          else {
            rhs_02._M_str = "stop";
            rhs_02._M_len = 4;
            bVar2 = jessilib::equalsi<char,char>(parameters,rhs_02);
            if ((bVar2) ||
               (rhs_03._M_str = "cancel", rhs_03._M_len = 6,
               bVar2 = jessilib::equalsi<char,char>(parameters,rhs_03), bVar2)) {
              cVar1 = RenX::Server::gameoverStop();
              if (cVar1 == '\0') {
                Jupiter::IRC::Client::sendNotice
                          (source,nick._M_len,nick._M_str,0x26,
                           "Error: There is no gameover scheduled.");
              }
              else {
                RenX::Server::sendMessage
                          (lVar3,0x32,"Notice: The scheduled gameover has been cancelled.");
              }
            }
            else {
              lVar6 = 10;
              if (parameters._M_len != 0) {
                in_string._M_str = extraout_RDX;
                in_string._M_len = (size_t)parameters._M_str;
                lVar6 = Jupiter::from_string<long_long>((Jupiter *)parameters._M_len,in_string);
              }
              string_printf_abi_cxx11_
                        (&local_50,"Notice: This server will gameover in %lld seconds.",lVar6);
              RenX::Server::sendMessage(lVar3,local_50._M_string_length,local_50._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&local_50);
              RenX::Server::gameover(lVar3,lVar6);
            }
          }
        }
        bVar2 = true;
      }
LAB_0012c288:
      uVar7 = uVar7 + 1;
    }
    if (!bVar2) {
      Jupiter::IRC::Client::sendMessage
                (source,channel._M_len,channel._M_str,0x40,
                 "Error: Channel not attached to any connected Renegade X servers.");
    }
  }
  return;
}

Assistant:

void GameOverIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr)
	{
		int type = chan->getType();
		bool match = false;
		std::chrono::seconds delay;

		for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
		{
			RenX::Server *server = RenX::getCore()->getServer(i);
			if (server->isLogChanType(type))
			{
				match = true;
				if (jessilib::equalsi(parameters, "empty"sv))
					server->gameoverWhenEmpty();
				else if (jessilib::equalsi(parameters, "if empty"sv))
				{
					if (server->players.size() == server->getBotCount())
						server->gameover();
				}
				else if (jessilib::equalsi(parameters, "now"sv))
					server->gameover();
				else if (jessilib::equalsi(parameters, "stop"sv) || jessilib::equalsi(parameters, "cancel"sv))
				{
					if (server->gameoverStop())
						server->sendMessage("Notice: The scheduled gameover has been cancelled."sv);
					else
						source->sendNotice(nick, "Error: There is no gameover scheduled."sv);
				}
				else
				{
					if (parameters.empty())
						delay = std::chrono::seconds(10);
					else
						delay = std::chrono::seconds(Jupiter::from_string<long long>(parameters));

					server->sendMessage(string_printf("Notice: This server will gameover in %lld seconds.", static_cast<long long>(delay.count())));
					server->gameover(delay);
				}
			}
		}
		if (match == false)
			source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
	}
}